

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O1

int build_regex_nfa(LexState *ls,uint8 **areg,NFAState *pp,NFAState *nn,Action *trailing)

{
  byte *pbVar1;
  Action **ppAVar2;
  anon_struct_40_4_d8687ec6_for_accepts *v;
  long lVar3;
  uint *v_00;
  uint uVar4;
  int iVar5;
  Action **ppAVar6;
  long lVar7;
  NFAState **ppNVar8;
  uint8 **ppuVar9;
  byte bVar10;
  int iVar11;
  ushort **ppuVar12;
  NFAState *pNVar13;
  __int32_t **pp_Var14;
  byte bVar15;
  uint uVar16;
  byte bVar17;
  NFAState **ppNVar18;
  NFAState *pNVar19;
  anon_struct_40_4_d8687ec6_for_epsilon *paVar20;
  anon_struct_40_4_d8687ec6 *v_01;
  long lVar21;
  char *pcVar22;
  long lVar23;
  ulong uVar24;
  uint8 mark [256];
  byte *local_170;
  NFAState *local_168;
  uint8 **local_160;
  Action *local_158;
  anon_struct_40_4_d8687ec6_for_epsilon *local_150;
  NFAState **local_148;
  NFAState *local_140;
  char local_138 [264];
  
  local_150 = &pp->epsilon;
  local_148 = (pp->epsilon).e;
  uVar16 = 0;
  pNVar13 = pp;
  local_170 = *areg;
  local_168 = nn;
  local_160 = areg;
  local_158 = trailing;
  local_140 = pp;
LAB_001410d0:
  pNVar19 = pNVar13;
  ppuVar9 = local_160;
  pbVar1 = local_170 + 1;
  bVar10 = *local_170;
  pNVar13 = pNVar19;
  if (bVar10 < 0x3f) {
    local_170 = pbVar1;
    switch(bVar10) {
    case 0x28:
      pNVar13 = new_NFAState(ls);
      iVar11 = build_regex_nfa(ls,&local_170,pNVar19,pNVar13,trailing);
      uVar16 = (uint)(iVar11 != 0 || uVar16 != 0);
      pp = pNVar19;
      goto LAB_001410d0;
    case 0x29:
      goto switchD_00141105_caseD_29;
    case 0x2a:
      ppNVar18 = (pp->epsilon).v;
      ppNVar8 = (pp->epsilon).e;
      if (ppNVar18 == (NFAState **)0x0) {
        (pp->epsilon).v = ppNVar8;
        uVar4 = (pp->epsilon).n;
        (pp->epsilon).n = uVar4 + 1;
        (pp->epsilon).e[uVar4] = pNVar19;
      }
      else {
        paVar20 = &pp->epsilon;
        uVar4 = paVar20->n;
        if (ppNVar18 == ppNVar8) {
          if (2 < uVar4) goto LAB_001415ce;
        }
        else if ((uVar4 & 7) == 0) {
LAB_001415ce:
          vec_add_internal(paVar20,pNVar19);
          goto switchD_00141105_caseD_2b;
        }
        paVar20->n = uVar4 + 1;
        ppNVar18[uVar4] = pNVar19;
      }
    case 0x2b:
switchD_00141105_caseD_2b:
      ppNVar18 = (pNVar19->epsilon).v;
      ppNVar8 = (pNVar19->epsilon).e;
      if (ppNVar18 == (NFAState **)0x0) {
        (pNVar19->epsilon).v = ppNVar8;
        uVar4 = (pNVar19->epsilon).n;
        (pNVar19->epsilon).n = uVar4 + 1;
        (pNVar19->epsilon).e[uVar4] = pp;
        goto LAB_001410d0;
      }
      paVar20 = &pNVar19->epsilon;
      uVar4 = paVar20->n;
      pNVar19 = pp;
      if (ppNVar18 == ppNVar8) {
        if (uVar4 < 3) goto LAB_00141630;
      }
      else if ((uVar4 & 7) != 0) {
LAB_00141630:
        paVar20->n = uVar4 + 1;
        ppNVar18[uVar4] = pp;
        goto LAB_001410d0;
      }
      break;
    case 0x2f:
      ppAVar6 = (pNVar19->accepts).v;
      ppAVar2 = (pNVar19->accepts).e;
      if (ppAVar6 == (Action **)0x0) {
        (pNVar19->accepts).v = ppAVar2;
        uVar16 = (pNVar19->accepts).n;
        (pNVar19->accepts).n = uVar16 + 1;
        (pNVar19->accepts).e[uVar16] = trailing;
      }
      else {
        v = &pNVar19->accepts;
        uVar16 = v->n;
        if (ppAVar6 == ppAVar2) {
          if (2 < uVar16) goto LAB_00141657;
        }
        else if ((uVar16 & 7) == 0) {
LAB_00141657:
          vec_add_internal(v,trailing);
          goto LAB_0014165f;
        }
        v->n = uVar16 + 1;
        ppAVar6[uVar16] = trailing;
      }
LAB_0014165f:
      uVar16 = 1;
      goto LAB_001410d0;
    default:
      if (bVar10 == 0) goto switchD_00141105_caseD_29;
    case 0x2c:
    case 0x2d:
    case 0x2e:
switchD_00141105_caseD_2c:
      local_170 = pbVar1;
      uVar24 = (ulong)bVar10;
      if ((ls->ignore_case != 0) &&
         (ppuVar12 = __ctype_b_loc(), (*(byte *)((long)*ppuVar12 + uVar24 * 2 + 1) & 4) != 0)) {
        pp_Var14 = __ctype_tolower_loc();
        iVar11 = (*pp_Var14)[uVar24];
        ppNVar8 = pNVar19->chars[iVar11].v;
        if (ppNVar8 == (NFAState **)0x0) {
          pNVar13 = new_NFAState(ls);
          iVar11 = *(int *)((long)*pp_Var14 + (ulong)((uint)bVar10 * 4));
          ppNVar8 = pNVar19->chars[iVar11].e;
          ppNVar8[-1] = (NFAState *)ppNVar8;
          iVar5 = *(int *)((long)*pp_Var14 + (ulong)((uint)bVar10 * 4));
          uVar4 = pNVar19->chars[iVar5].n;
          pNVar19->chars[iVar5].n = uVar4 + 1;
          pNVar19->chars[iVar11].e[uVar4] = pNVar13;
        }
        else {
          uVar4 = pNVar19->chars[iVar11].n;
          if (ppNVar8 == pNVar19->chars[iVar11].e) {
            if (uVar4 < 3) goto LAB_00141538;
          }
          else if ((uVar4 & 7) != 0) {
LAB_00141538:
            pNVar13 = new_NFAState(ls);
            iVar11 = (*pp_Var14)[uVar24];
            ppNVar8 = pNVar19->chars[iVar11].v;
            uVar4 = pNVar19->chars[iVar11].n;
            pNVar19->chars[iVar11].n = uVar4 + 1;
            ppNVar8[uVar4] = pNVar13;
            trailing = local_158;
            goto LAB_001417ce;
          }
          pNVar13 = new_NFAState(ls);
          vec_add_internal(pNVar19->chars + iVar11,pNVar13);
          trailing = local_158;
        }
LAB_001417ce:
        pp_Var14 = __ctype_toupper_loc();
        v_01 = pNVar19->chars + (*pp_Var14)[uVar24];
        ppNVar8 = v_01->v;
        ppNVar18 = pNVar19->chars[(*pp_Var14)[uVar24]].e;
        if (ppNVar8 == (NFAState **)0x0) {
          v_01->v = ppNVar18;
          uVar4 = pNVar19->chars[(*pp_Var14)[uVar24]].n;
          pNVar19->chars[(*pp_Var14)[uVar24]].n = uVar4 + 1;
          v_01->e[uVar4] = pNVar13;
          pp = pNVar19;
          goto LAB_001410d0;
        }
        uVar4 = v_01->n;
        if (ppNVar8 == ppNVar18) {
          if (uVar4 < 3) goto LAB_0014185d;
        }
        else if ((uVar4 & 7) != 0) {
LAB_0014185d:
          v_01->n = uVar4 + 1;
          ppNVar8[uVar4] = pNVar13;
          pp = pNVar19;
          goto LAB_001410d0;
        }
LAB_0014186e:
        vec_add_internal(v_01,pNVar13);
        pp = pNVar19;
        goto LAB_001410d0;
      }
      v_01 = pNVar19->chars + uVar24;
      ppNVar8 = pNVar19->chars[uVar24].v;
      if (ppNVar8 == (NFAState **)0x0) {
        pNVar13 = new_NFAState(ls);
        pNVar19->chars[uVar24].v = pNVar19->chars[uVar24].e;
        uVar4 = v_01->n;
        v_01->n = uVar4 + 1;
        pNVar19->chars[uVar24].e[uVar4] = pNVar13;
        pp = pNVar19;
      }
      else {
        if (ppNVar8 == pNVar19->chars[uVar24].e) {
          if (2 < v_01->n) goto LAB_001415a7;
        }
        else if ((v_01->n & 7) == 0) {
LAB_001415a7:
          pNVar13 = new_NFAState(ls);
          goto LAB_0014186e;
        }
        pNVar13 = new_NFAState(ls);
        ppNVar8 = pNVar19->chars[uVar24].v;
        uVar4 = v_01->n;
        v_01->n = uVar4 + 1;
        ppNVar8[uVar4] = pNVar13;
        pp = pNVar19;
      }
      goto LAB_001410d0;
    }
  }
  else {
    if (0x5b < bVar10) {
      if (bVar10 == 0x5c) {
        pbVar1 = local_170 + 2;
        bVar10 = local_170[1];
        local_170 = pbVar1;
        if (bVar10 == 0) {
LAB_00141880:
          d_fail("bad (part of) regex: %s\n",*local_160);
          return uVar16;
        }
        goto switchD_00141105_caseD_2c;
      }
      if (bVar10 == 0x7c) {
        ppNVar18 = (pNVar19->epsilon).v;
        ppNVar8 = (pNVar19->epsilon).e;
        if (ppNVar18 == (NFAState **)0x0) {
          (pNVar19->epsilon).v = ppNVar8;
          uVar4 = (pNVar19->epsilon).n;
          (pNVar19->epsilon).n = uVar4 + 1;
          (pNVar19->epsilon).e[uVar4] = local_168;
          local_170 = pbVar1;
        }
        else {
          paVar20 = &pNVar19->epsilon;
          uVar4 = paVar20->n;
          if (ppNVar18 == ppNVar8) {
            if (2 < uVar4) goto LAB_00141683;
          }
          else if ((uVar4 & 7) == 0) {
LAB_00141683:
            local_170 = pbVar1;
            vec_add_internal(paVar20,local_168);
            goto LAB_00141690;
          }
          paVar20->n = uVar4 + 1;
          ppNVar18[uVar4] = local_168;
          local_170 = pbVar1;
        }
LAB_00141690:
        pNVar19 = local_140;
        ppNVar8 = (local_140->epsilon).v;
        if (ppNVar8 != (NFAState **)0x0) {
          if (ppNVar8 == local_148) {
            if (2 < local_150->n) goto LAB_00141715;
          }
          else if ((local_150->n & 7) == 0) {
LAB_00141715:
            pNVar13 = new_NFAState(ls);
            vec_add_internal(local_150,pNVar13);
            goto LAB_001410d0;
          }
          pNVar13 = new_NFAState(ls);
          uVar4 = (pNVar19->epsilon).n;
          (pNVar19->epsilon).n = uVar4 + 1;
          (pNVar19->epsilon).v[uVar4] = pNVar13;
          goto LAB_001410d0;
        }
        pNVar13 = new_NFAState(ls);
        (pNVar19->epsilon).v = local_148;
        uVar4 = (pNVar19->epsilon).n;
        (pNVar19->epsilon).n = uVar4 + 1;
        (pNVar19->epsilon).e[uVar4] = pNVar13;
        goto LAB_001410d0;
      }
      goto switchD_00141105_caseD_2c;
    }
    if (bVar10 != 0x3f) {
      if (bVar10 == 0x5b) {
        bVar10 = *pbVar1;
        if (bVar10 == 0x5e) {
          pbVar1 = local_170 + 2;
        }
        local_170 = pbVar1;
        memset(local_138,0,0x100);
        bVar15 = 0xff;
LAB_0014117d:
        do {
          pbVar1 = local_170 + 1;
          bVar17 = *local_170;
          if (bVar17 < 0x5c) {
            if (bVar17 == 0x2d) {
              bVar17 = local_170[1];
              if (bVar17 == 0x5c) {
                bVar17 = local_170[2];
                local_170 = local_170 + 3;
              }
              else {
                local_170 = local_170 + 2;
                if (bVar17 == 0) goto LAB_00141880;
              }
              if (bVar17 == 0) goto LAB_00141880;
              for (; bVar15 <= bVar17; bVar15 = bVar15 + 1) {
                local_138[bVar15] = '\x01';
              }
              goto LAB_0014117d;
            }
            local_170 = pbVar1;
            if (bVar17 == 0) goto LAB_00141311;
          }
          else if (bVar17 == 0x5c) {
            bVar17 = local_170[1];
            local_170 = local_170 + 2;
          }
          else {
            local_170 = pbVar1;
            if (bVar17 == 0x5d) goto LAB_00141311;
          }
          local_138[bVar17] = '\x01';
          bVar15 = bVar17;
        } while( true );
      }
      goto switchD_00141105_caseD_2c;
    }
    ppNVar18 = (pp->epsilon).v;
    ppNVar8 = (pp->epsilon).e;
    if (ppNVar18 == (NFAState **)0x0) {
      (pp->epsilon).v = ppNVar8;
      uVar4 = (pp->epsilon).n;
      (pp->epsilon).n = uVar4 + 1;
      (pp->epsilon).e[uVar4] = pNVar19;
      local_170 = pbVar1;
      goto LAB_001410d0;
    }
    paVar20 = &pp->epsilon;
    uVar4 = paVar20->n;
    if (ppNVar18 == ppNVar8) {
      local_170 = pbVar1;
      if (2 < uVar4) goto LAB_0014174c;
LAB_0014173b:
      paVar20->n = uVar4 + 1;
      ppNVar18[uVar4] = pNVar19;
      local_170 = pbVar1;
      goto LAB_001410d0;
    }
    local_170 = pbVar1;
    if ((uVar4 & 7) != 0) goto LAB_0014173b;
  }
LAB_0014174c:
  vec_add_internal(paVar20,pNVar19);
  goto LAB_001410d0;
LAB_00141311:
  local_170 = pbVar1;
  pNVar13 = new_NFAState(ls);
  lVar23 = 0x40;
  lVar21 = 0x30;
  pcVar22 = local_138;
  do {
    pcVar22 = pcVar22 + 1;
    if ((*pcVar22 == '\0') == (bVar10 == 0x5e)) {
      lVar7 = *(long *)((long)pNVar19->chars[0].e + lVar21 + -0x10);
      lVar3 = (long)pNVar19->chars[0].e + lVar23 + -0x18;
      if (lVar7 == 0) {
        *(long *)((long)pNVar19->chars[0].e + lVar21 + -0x10) = lVar3;
        uVar4 = *(uint *)((long)pNVar19->chars[0].e + lVar21 + -0x18);
        *(uint *)((long)pNVar19->chars[0].e + lVar21 + -0x18) = uVar4 + 1;
        *(NFAState **)((long)pNVar19->chars[0].e + lVar23 + (ulong)uVar4 * 8 + -0x18) = pNVar13;
      }
      else {
        v_00 = (uint *)((long)pNVar19->chars[0].e + lVar21 + -0x18);
        uVar4 = *v_00;
        if (lVar3 == lVar7) {
          if (2 < uVar4) goto LAB_00141398;
        }
        else if ((uVar4 & 7) == 0) {
LAB_00141398:
          vec_add_internal(v_00,pNVar13);
          goto LAB_001413a0;
        }
        *v_00 = uVar4 + 1;
        *(NFAState **)(lVar7 + (ulong)uVar4 * 8) = pNVar13;
      }
    }
LAB_001413a0:
    lVar23 = lVar23 + 0x28;
    lVar21 = lVar21 + 0x28;
    trailing = local_158;
    pp = pNVar19;
  } while (lVar23 != 0x2818);
  goto LAB_001410d0;
switchD_00141105_caseD_29:
  ppNVar18 = (pNVar19->epsilon).v;
  ppNVar8 = (pNVar19->epsilon).e;
  if (ppNVar18 == (NFAState **)0x0) {
    (pNVar19->epsilon).v = ppNVar8;
    uVar4 = (pNVar19->epsilon).n;
    (pNVar19->epsilon).n = uVar4 + 1;
    (pNVar19->epsilon).e[uVar4] = local_168;
    goto LAB_0014192d;
  }
  paVar20 = &pNVar19->epsilon;
  uVar4 = paVar20->n;
  if (ppNVar18 == ppNVar8) {
    if (2 < uVar4) goto LAB_00141920;
  }
  else if ((uVar4 & 7) == 0) {
LAB_00141920:
    vec_add_internal(paVar20,local_168);
    goto LAB_0014192d;
  }
  paVar20->n = uVar4 + 1;
  ppNVar18[uVar4] = local_168;
LAB_0014192d:
  *ppuVar9 = local_170;
  return uVar16;
}

Assistant:

static int build_regex_nfa(LexState *ls, uint8 **areg, NFAState *pp, NFAState *nn, Action *trailing) {
  uint8 c, pc, *reg = *areg;
  NFAState *p = pp, *s, *x, *n = nn;
  int reversed, i, has_trailing = 0;
  uint8 mark[256];

  s = p;
  while ((c = *reg++)) {
    switch (c) {
      case '(':
        has_trailing = build_regex_nfa(ls, &reg, s, (x = new_NFAState(ls)), trailing) || has_trailing;
        p = s;
        s = x;
        break;
      case ')':
        goto Lreturn;
      case '|':
        vec_add(&s->epsilon, nn);
        vec_add(&pp->epsilon, (s = new_NFAState(ls)));
        break;
      case '[':
        if (*reg == '^') {
          reg++;
          reversed = 1;
        } else
          reversed = 0;
        memset(mark, 0, sizeof(mark));
        pc = UCHAR_MAX;
        while ((c = *reg++)) {
          switch (c) {
            case ']':
              goto Lsetdone;
            case '-':
              c = *reg++;
              if (!c) goto Lerror;
              if (c == '\\') c = *reg++;
              if (!c) goto Lerror;
              for (; pc <= c; pc++) mark[pc] = 1;
              break;
            case '\\':
              c = *reg++;
              /* fall through */
            default:
              pc = c;
              mark[c] = 1;
              break;
          }
        }
      Lsetdone:
        x = new_NFAState(ls);
        for (i = 1; i < 256; i++)
          if ((!reversed && mark[i]) || (reversed && !mark[i])) vec_add(&s->chars[i], x);
        p = s;
        s = x;
        break;
      case '?':
        vec_add(&p->epsilon, s);
        break;
      case '*':
        vec_add(&p->epsilon, s);
        vec_add(&s->epsilon, p);
        break;
      case '+':
        vec_add(&s->epsilon, p);
        break;
      case '/':
        vec_add(&s->accepts, trailing);
        has_trailing = 1;
        break;
      case '\\':
        c = *reg++;
        if (!c) goto Lerror;
        /* fall through */
      default:
        if (!ls->ignore_case || !isalpha(c))
          vec_add(&s->chars[c], (x = new_NFAState(ls)));
        else {
          vec_add(&s->chars[tolower(c)], (x = new_NFAState(ls)));
          vec_add(&s->chars[toupper(c)], x);
        }
        p = s;
        s = x;
        break;
    }
  }
Lreturn:
  vec_add(&s->epsilon, n);
  *areg = reg;
  return has_trailing;
Lerror:
  d_fail("bad (part of) regex: %s\n", *areg);
  return has_trailing;
}